

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions2.cpp
# Opt level: O1

void __thiscall converterApp::~converterApp(converterApp *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void loadFile(const std::string& file)
    {
        std::ifstream input(file);
        ASSERT_TRUE(input);
        std::string line;
        while (std::getline(input, line)) {
            if (line.empty()) {
                continue;
            }
            auto ploc = line.find_first_of('.');
            auto namestartloc = line.find_first_not_of(' ', ploc + 1);
            auto nameend = line.find_first_of("[:", namestartloc + 1);
            std::string name =
                line.substr(namestartloc, nameend - namestartloc);
            while (name.back() == ' ') {
                name.pop_back();
            }
            std::string shortname;
            if (line[nameend] == '[') {
                auto snameend = line.find_first_of(']', nameend + 1);
                shortname = line.substr(nameend + 1, snameend - nameend - 1);
            }
            std::getline(input, line);
            double value = stod(line);
            unit_conv.emplace_back(name, shortname, value);
        }
    }